

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

lu_mem atomic(lua_State *L)

{
  ushort uVar1;
  global_State *g;
  GCObject *pGVar2;
  GCObject *pGVar3;
  lu_mem lVar4;
  lua_State *plVar5;
  lu_mem lVar6;
  long lVar7;
  long lVar8;
  UpVal *pUVar9;
  long lVar10;
  lua_State **pplVar11;
  long lVar12;
  ulong uVar13;
  
  g = L->l_G;
  pGVar2 = g->grayagain;
  g->grayagain = (GCObject *)0x0;
  if ((g->ephemeron != (GCObject *)0x0) || (g->weak != (GCObject *)0x0)) {
    __assert_fail("g->ephemeron == ((void*)0) && g->weak == ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                  ,0x655,"lu_mem atomic(lua_State *)");
  }
  if ((g->mainthread->marked & 0x18) != 0) {
    __assert_fail("!(((g->mainthread)->marked) & (((1<<(3)) | (1<<(4)))))",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                  ,0x656,"lu_mem atomic(lua_State *)");
  }
  g->gcstate = '\x02';
  if ((L->marked & 0x18) != 0) {
    if (9 < (L->tt & 0xe)) {
      __assert_fail("(((L)->tt) & 0x0F) < (9+1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                    ,0x658,"lu_mem atomic(lua_State *)");
    }
    reallymarkobject(g,(GCObject *)L);
  }
  uVar1 = (g->l_registry).tt_;
  if ((short)uVar1 < 0) {
    pGVar3 = (g->l_registry).value_.gc;
    if (((uVar1 & 0x7f) != (ushort)pGVar3->tt) ||
       ((g->mainthread != (lua_State *)0x0 &&
        ((pGVar3->marked & (g->mainthread->l_G->currentwhite ^ 0x18)) != 0)))) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                    ,0x65a,"lu_mem atomic(lua_State *)");
    }
    if (((short)uVar1 < 0) && (pGVar3 = (g->l_registry).value_.gc, (pGVar3->marked & 0x18) != 0)) {
      reallymarkobject(g,pGVar3);
    }
  }
  markmt(g);
  if (g->gray == (GCObject *)0x0) {
    lVar7 = 0;
  }
  else {
    lVar7 = 0;
    do {
      lVar4 = propagatemark(g);
      lVar7 = lVar7 + lVar4;
    } while (g->gray != (GCObject *)0x0);
  }
  plVar5 = g->twups;
  uVar13 = 0;
  if (plVar5 != (lua_State *)0x0) {
    pplVar11 = &g->twups;
    do {
      uVar13 = (ulong)((int)uVar13 + 1);
      if (((plVar5->marked & 0x18) == 0) && (plVar5->openupval != (UpVal *)0x0)) {
        pplVar11 = &plVar5->twups;
      }
      else {
        if (((plVar5->marked & 6) != 0) && (plVar5->openupval != (UpVal *)0x0)) {
          __assert_fail("!(((thread)->marked & 7) > 1) || thread->openupval == ((void*)0)",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                        ,0x1cf,"int remarkupvals(global_State *)");
        }
        *pplVar11 = plVar5->twups;
        plVar5->twups = plVar5;
        for (pUVar9 = plVar5->openupval; pUVar9 != (UpVal *)0x0; pUVar9 = (pUVar9->u).open.next) {
          if ((pUVar9->u).open.touched != 0) {
            uVar1 = pUVar9->v->tt_;
            if ((short)uVar1 < 0) {
              pGVar3 = (pUVar9->v->value_).gc;
              if (((uVar1 & 0x7f) != (ushort)pGVar3->tt) ||
                 ((g->mainthread != (lua_State *)0x0 &&
                  ((pGVar3->marked & (g->mainthread->l_G->currentwhite ^ 0x18)) != 0)))) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                              ,0x1d5,"int remarkupvals(global_State *)");
              }
              if ((pGVar3->marked & 0x18) != 0) {
                reallymarkobject(g,pGVar3);
              }
            }
            (pUVar9->u).open.touched = 0;
          }
          uVar13 = (ulong)((int)uVar13 + 1);
        }
      }
      plVar5 = *pplVar11;
    } while (plVar5 != (lua_State *)0x0);
    uVar13 = (ulong)(int)uVar13;
  }
  if (g->gray == (GCObject *)0x0) {
    lVar12 = 0;
  }
  else {
    lVar12 = 0;
    do {
      lVar4 = propagatemark(g);
      lVar12 = lVar12 + lVar4;
    } while (g->gray != (GCObject *)0x0);
  }
  g->gray = pGVar2;
  if (pGVar2 == (GCObject *)0x0) {
    lVar8 = 0;
  }
  else {
    lVar8 = 0;
    do {
      lVar4 = propagatemark(g);
      lVar8 = lVar8 + lVar4;
    } while (g->gray != (GCObject *)0x0);
  }
  convergeephemerons(g);
  lVar10 = 0;
  clearbyvalues(g,g->weak,(GCObject *)0x0);
  clearbyvalues(g,g->allweak,(GCObject *)0x0);
  pGVar2 = g->weak;
  pGVar3 = g->allweak;
  separatetobefnz(g,0);
  lVar4 = markbeingfnz(g);
  if (g->gray != (GCObject *)0x0) {
    lVar10 = 0;
    do {
      lVar6 = propagatemark(g);
      lVar10 = lVar10 + lVar6;
    } while (g->gray != (GCObject *)0x0);
  }
  convergeephemerons(g);
  clearbykeys(g,g->ephemeron);
  clearbykeys(g,g->allweak);
  clearbyvalues(g,g->weak,pGVar2);
  clearbyvalues(g,g->allweak,pGVar3);
  luaS_clearcache(g);
  g->currentwhite = g->currentwhite ^ 0x18;
  if (g->gray != (GCObject *)0x0) {
    __assert_fail("g->gray == ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                  ,0x675,"lu_mem atomic(lua_State *)");
  }
  return lVar12 + lVar8 + lVar7 + uVar13 + lVar4 + lVar10;
}

Assistant:

static lu_mem atomic (lua_State *L) {
  global_State *g = G(L);
  lu_mem work = 0;
  GCObject *origweak, *origall;
  GCObject *grayagain = g->grayagain;  /* save original list */
  g->grayagain = NULL;
  lua_assert(g->ephemeron == NULL && g->weak == NULL);
  lua_assert(!iswhite(g->mainthread));
  g->gcstate = GCSatomic;
  markobject(g, L);  /* mark running thread */
  /* registry and global metatables may be changed by API */
  markvalue(g, &g->l_registry);
  markmt(g);  /* mark global metatables */
  work += propagateall(g);  /* empties 'gray' list */
  /* remark occasional upvalues of (maybe) dead threads */
  work += remarkupvals(g);
  work += propagateall(g);  /* propagate changes */
  g->gray = grayagain;
  work += propagateall(g);  /* traverse 'grayagain' list */
  convergeephemerons(g);
  /* at this point, all strongly accessible objects are marked. */
  /* Clear values from weak tables, before checking finalizers */
  clearbyvalues(g, g->weak, NULL);
  clearbyvalues(g, g->allweak, NULL);
  origweak = g->weak; origall = g->allweak;
  separatetobefnz(g, 0);  /* separate objects to be finalized */
  work += markbeingfnz(g);  /* mark objects that will be finalized */
  work += propagateall(g);  /* remark, to propagate 'resurrection' */
  convergeephemerons(g);
  /* at this point, all resurrected objects are marked. */
  /* remove dead objects from weak tables */
  clearbykeys(g, g->ephemeron);  /* clear keys from all ephemeron tables */
  clearbykeys(g, g->allweak);  /* clear keys from all 'allweak' tables */
  /* clear values from resurrected weak tables */
  clearbyvalues(g, g->weak, origweak);
  clearbyvalues(g, g->allweak, origall);
  luaS_clearcache(g);
  g->currentwhite = cast_byte(otherwhite(g));  /* flip current white */
  lua_assert(g->gray == NULL);
  return work;  /* estimate of slots marked by 'atomic' */
}